

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

int hts_useek(htsFile *fp,long uoffset,int where)

{
  int *piVar1;
  int iVar2;
  SAM_hdr *fp_00;
  
  fp_00 = (SAM_hdr *)(fp->fp).bgzf;
  if ((undefined1  [96])((undefined1  [96])*fp & (undefined1  [96])0x1) == (undefined1  [96])0x0) {
    *(int *)((long)&(fp_00->text).l + 4) = 0;
    *(undefined4 *)(fp->fp).bgzf = 0;
    piVar1 = &((fp->fp).bgzf)->block_length;
    *piVar1 = *piVar1 & 0xfffffffc;
    ((fp->fp).bgzf)->block_address = uoffset;
    fp_00 = ((fp->fp).cram)->header;
  }
  iVar2 = bgzf_useek((BGZF *)fp_00,uoffset,where);
  return iVar2;
}

Assistant:

int hts_useek(htsFile *fp, long uoffset, int where)
{
    if ( fp->is_bin )
        return bgzf_useek(fp->fp.bgzf, uoffset, where);
    else
    {
        ks_rewind((kstream_t*)fp->fp.voidp);
        ((kstream_t*)fp->fp.voidp)->seek_pos = uoffset;
        return bgzf_useek(((kstream_t*)fp->fp.voidp)->f, uoffset, where);
    }
}